

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

void luaF_close(lua_State *L,StkId level)

{
  global_State *g;
  GCObject *uv;
  
  uv = L->openupval;
  if (uv != (GCObject *)0x0) {
    g = L->l_G;
    do {
      if ((uv->h).array < level) {
        return;
      }
      L->openupval = (uv->gch).next;
      if ((byte)((g->currentwhite ^ 3) & ((uv->gch).marked ^ 3)) == 0) {
        luaF_freeupval(L,&uv->uv);
      }
      else {
        ((uv->th).ci)->next = (CallInfo *)(uv->h).node;
        ((uv->th).l_G)->GCmemtrav = (lu_mem)(uv->h).lastfree;
        (uv->h).node = (Node *)((uv->h).array)->value_;
        *(int *)&(uv->h).lastfree = ((uv->h).array)->tt_;
        (uv->h).array = (TValue *)&(uv->h).node;
        (uv->gch).next = g->allgc;
        g->allgc = uv;
        luaC_checkupvalcolor(g,&uv->uv);
      }
      uv = L->openupval;
    } while (uv != (GCObject *)0x0);
  }
  return;
}

Assistant:

void luaF_close (lua_State *L, StkId level) {
  UpVal *uv;
  global_State *g = G(L);
  while (L->openupval != NULL && (uv = gco2uv(L->openupval))->v >= level) {
    GCObject *o = obj2gco(uv);
    lua_assert(!isblack(o) && uv->v != &uv->u.value);
    L->openupval = uv->next;  /* remove from `open' list */
    if (isdead(g, o))
      luaF_freeupval(L, uv);  /* free upvalue */
    else {
      unlinkupval(uv);  /* remove upvalue from 'uvhead' list */
      setobj(L, &uv->u.value, uv->v);  /* move value to upvalue slot */
      uv->v = &uv->u.value;  /* now current value lives here */
      gch(o)->next = g->allgc;  /* link upvalue into 'allgc' list */
      g->allgc = o;
      luaC_checkupvalcolor(g, uv);
    }
  }
}